

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall spvtools::opt::Instruction::UpdateDebugInfoFrom(Instruction *this,Instruction *from)

{
  pointer pIVar1;
  bool bVar2;
  DebugInfoManager *this_00;
  
  if (from != (Instruction *)0x0) {
    ClearDbgLineInsts(this);
    pIVar1 = (from->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((from->dbg_line_insts_).
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start != pIVar1) {
      AddDebugLine(this,pIVar1 + -1);
    }
    SetDebugScope(this,&from->dbg_scope_);
    bVar2 = IsLineInst(this);
    if ((!bVar2) && ((this->context_->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone)) {
      this_00 = IRContext::get_debug_info_mgr(this->context_);
      analysis::DebugInfoManager::AnalyzeDebugInst(this_00,this);
      return;
    }
  }
  return;
}

Assistant:

void Instruction::UpdateDebugInfoFrom(const Instruction* from) {
  if (from == nullptr) return;
  ClearDbgLineInsts();
  if (!from->dbg_line_insts().empty())
    AddDebugLine(&from->dbg_line_insts().back());
  SetDebugScope(from->GetDebugScope());
  if (!IsLineInst() &&
      context()->AreAnalysesValid(IRContext::kAnalysisDebugInfo)) {
    context()->get_debug_info_mgr()->AnalyzeDebugInst(this);
  }
}